

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O1

bool __thiscall
cppcms::sessions::session_file_storage::read_all(session_file_storage *this,int fd,void *vbuf,int n)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  
  bVar4 = n < 1;
  if (0 < n) {
    do {
      sVar2 = read(fd,vbuf,(ulong)(uint)n);
      iVar5 = (int)sVar2;
      if (iVar5 < 0) {
        piVar3 = __errno_location();
        bVar1 = false;
        if (*piVar3 != 4) goto LAB_0023ebdf;
      }
      else {
LAB_0023ebdf:
        bVar1 = iVar5 < 1;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        n = n - iVar5;
      }
    } while ((!bVar1) && (bVar4 = n < 1, 0 < n));
  }
  return bVar4;
}

Assistant:

bool session_file_storage::read_all(int fd,void *vbuf,int n)
{
	char *buf=reinterpret_cast<char *>(vbuf);
	while(n > 0) {
		int res = ::read(fd,buf,n);
		if(res < 0 && errno==EINTR)
			continue;
		if(res <= 0)
			return false;
		n-=res;
	}
	return true;
}